

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O0

Bounds string2bounds(string *boundString)

{
  char *pcVar1;
  long lVar2;
  char *local_b0;
  char *t_1;
  char *s_1;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  char *t;
  char *s;
  string *boundString_local;
  Bounds bounds;
  
  boundString_local = (string *)0x7fffffff00000000;
  s = (char *)boundString;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)boundString);
  if (*pcVar1 == ':') {
    std::__cxx11::string::substr((ulong)&s_1,(ulong)boundString);
    std::__cxx11::string::operator=((string *)boundString,(string *)&s_1);
    std::__cxx11::string::~string((string *)&s_1);
  }
  else {
    t = (char *)std::__cxx11::string::c_str();
    lVar2 = strtol(t,&local_28,10);
    boundString_local = (string *)CONCAT44(boundString_local._4_4_,(int)lVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,local_28,&local_49);
    std::__cxx11::string::operator=((string *)boundString,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      boundString_local = (string *)CONCAT44((int)boundString_local,(int)boundString_local);
    }
    else {
      std::__cxx11::string::substr((ulong)local_80,(ulong)boundString);
      std::__cxx11::string::operator=((string *)boundString,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    t_1 = (char *)std::__cxx11::string::c_str();
    lVar2 = strtol(t_1,&local_b0,10);
    boundString_local = (string *)CONCAT44((int)lVar2,(int)boundString_local);
  }
  if (boundString_local._4_4_ < (int)boundString_local) {
    std::swap<int>((int *)((long)&boundString_local + 4),(int *)&boundString_local);
  }
  return (Bounds)boundString_local;
}

Assistant:

Bounds string2bounds(std::string boundString)
{
	Bounds bounds = { 0, std::numeric_limits<int>::max() };

	if (boundString[0] != ':')
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.lower = strtol(s, &t, 10);
		boundString = std::string(t);
		if (boundString.length() == 0)
		{
			bounds.upper = bounds.lower;
		}
		else
		{
			boundString = boundString.substr(1);
		}
	}
	else
	{
		boundString = boundString.substr(1);
	}

	if (boundString.length() > 0)
	{
		const char *s = boundString.c_str();
		char *t;
		bounds.upper = strtol(s, &t, 10);
	}

	if (bounds.upper < bounds.lower)
	{
		std::swap(bounds.upper, bounds.lower);
	}

	return bounds;
}